

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# droplayer.cpp
# Opt level: O0

void __thiscall DROPlayer::ParseFile(DROPlayer *this,UINT32 ticks)

{
  bool bVar1;
  UINT32 ticks_local;
  DROPlayer *this_local;
  
  this->_playTick = ticks + this->_playTick;
  if ((this->_playState & 2) == 0) {
    if ((this->_fileHdr).verMajor < 2) {
      while( true ) {
        bVar1 = false;
        if (this->_fileTick <= this->_playTick) {
          bVar1 = (this->_playState & 2) == 0;
        }
        if (!bVar1) break;
        DoCommand_v1(this);
      }
    }
    else {
      while( true ) {
        bVar1 = false;
        if (this->_fileTick <= this->_playTick) {
          bVar1 = (this->_playState & 2) == 0;
        }
        if (!bVar1) break;
        DoCommand_v2(this);
      }
    }
  }
  return;
}

Assistant:

void DROPlayer::ParseFile(UINT32 ticks)
{
	_playTick += ticks;
	if (_playState & PLAYSTATE_END)
		return;
	
	if (_fileHdr.verMajor < 2)
	{
		while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
			DoCommand_v1();
	}
	else
	{
		while(_fileTick <= _playTick && ! (_playState & PLAYSTATE_END))
			DoCommand_v2();
	}
	
	return;
}